

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure_test.cc
# Opt level: O0

void __thiscall xLearn::DMATRIX_TEST_CopyFrom_Test::TestBody(DMATRIX_TEST_CopyFrom_Test *this)

{
  bool bVar1;
  reference pvVar2;
  char *pcVar3;
  undefined1 auVar4 [16];
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  float in_stack_000000d8;
  float in_stack_000000dc;
  char *in_stack_000000e0;
  AssertionResult gtest_ar_6;
  iterator iter;
  SparseRow *row;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  size_t i_1;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  DMatrix new_matrix;
  size_t i;
  DMatrix matrix;
  vector<xLearn::Node,_std::allocator<xLearn::Node>_> *in_stack_fffffffffffffd18;
  undefined7 in_stack_fffffffffffffd20;
  undefined1 in_stack_fffffffffffffd27;
  float *in_stack_fffffffffffffd28;
  undefined7 in_stack_fffffffffffffd30;
  undefined1 in_stack_fffffffffffffd37;
  char *in_stack_fffffffffffffd38;
  undefined7 in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffd67;
  undefined7 in_stack_fffffffffffffd70;
  undefined1 in_stack_fffffffffffffd77;
  AssertHelper local_250;
  Message local_248;
  AssertionResult local_240;
  AssertHelper local_230;
  Message local_228;
  AssertionResult local_220;
  AssertHelper local_210;
  Message local_208 [2];
  DMatrix *in_stack_fffffffffffffe08;
  DMatrix *in_stack_fffffffffffffe10;
  __normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
  in_stack_fffffffffffffe18;
  DMatrix *in_stack_fffffffffffffe20;
  AssertHelper local_1d8;
  Message local_1d0;
  undefined8 local_1c8;
  AssertionResult local_1c0;
  AssertHelper local_1b0;
  Message local_1a8;
  AssertionResult local_1a0;
  ulong local_190;
  AssertHelper local_188;
  Message local_180;
  undefined1 local_171;
  AssertionResult local_170;
  AssertHelper local_160;
  Message local_158;
  undefined4 local_14c;
  AssertionResult local_148;
  AssertHelper local_138;
  Message local_130;
  undefined4 local_124;
  AssertionResult local_120;
  AssertHelper local_110;
  Message local_108;
  AssertionResult local_100 [2];
  vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
  vStack_d8;
  vector<float,_std::allocator<float>_> local_c0;
  vector<float,_std::allocator<float>_> local_a8;
  ulong local_88;
  DMatrix local_70;
  
  DMatrix::DMatrix((DMatrix *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
  DMatrix::Reset((DMatrix *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
  for (local_88 = 0; local_88 < 10; local_88 = local_88 + 1) {
    DMatrix::AddRow((DMatrix *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30));
    auVar4 = SUB6416(ZEXT464(0x40200000),0);
    DMatrix::AddNode(in_stack_fffffffffffffe20,
                     (index_t)((ulong)in_stack_fffffffffffffe18._M_current >> 0x20),
                     (index_t)in_stack_fffffffffffffe18._M_current,
                     (real_t)((ulong)in_stack_fffffffffffffe10 >> 0x20),
                     (index_t)in_stack_fffffffffffffe10);
    auVar4 = vcvtusi2ss_avx512f(auVar4,local_88);
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](&local_70.Y,local_88);
    *pvVar2 = auVar4._0_4_;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](&local_70.norm,local_88);
    *pvVar2 = 0.25;
  }
  DMatrix::SetHash(&local_70,0x4d2,0x162e);
  DMatrix::DMatrix((DMatrix *)CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60));
  DMatrix::CopyFrom(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  DMatrix::Reset((DMatrix *)CONCAT17(in_stack_fffffffffffffd77,in_stack_fffffffffffffd70));
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
            (in_stack_fffffffffffffd38,
             (char *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
             (uint *)in_stack_fffffffffffffd28,
             (unsigned_long *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_100);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x153d5d);
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0xa3,pcVar3);
    testing::internal::AssertHelper::operator=(&local_110,&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    testing::Message::~Message((Message *)0x153dc0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x153e15);
  local_124 = 0x4d2;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            (in_stack_fffffffffffffd38,
             (char *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
             (unsigned_long *)in_stack_fffffffffffffd28,
             (int *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_120);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x153eb6);
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0xa4,pcVar3);
    testing::internal::AssertHelper::operator=(&local_138,&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    testing::Message::~Message((Message *)0x153f13);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x153f68);
  local_14c = 0x162e;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            (in_stack_fffffffffffffd38,
             (char *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
             (unsigned_long *)in_stack_fffffffffffffd28,
             (int *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_148);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x154009);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0xa5,pcVar3);
    testing::internal::AssertHelper::operator=(&local_160,&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    testing::Message::~Message((Message *)0x154066);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1540bb);
  local_171 = 1;
  testing::internal::EqHelper<false>::Compare<bool,bool>
            (in_stack_fffffffffffffd38,
             (char *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
             (bool *)in_stack_fffffffffffffd28,
             (bool *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_170);
  if (!bVar1) {
    testing::Message::Message(&local_180);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x154159);
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
               ,0xa6,pcVar3);
    testing::internal::AssertHelper::operator=(&local_188,&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    testing::Message::~Message((Message *)0x1541b6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x15420e);
  for (local_190 = 0; local_190 < 10; local_190 = local_190 + 1) {
    std::vector<float,_std::allocator<float>_>::operator[](&local_c0,local_190);
    testing::internal::EqHelper<false>::Compare<float,unsigned_long>
              (in_stack_fffffffffffffd38,
               (char *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
               in_stack_fffffffffffffd28,
               (unsigned_long *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1a0);
    if (!bVar1) {
      testing::Message::Message(&local_1a8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1542cf);
      testing::internal::AssertHelper::AssertHelper
                (&local_1b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
                 ,0xa8,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1b0,&local_1a8);
      testing::internal::AssertHelper::~AssertHelper(&local_1b0);
      testing::Message::~Message((Message *)0x15432c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x154381);
    std::vector<float,_std::allocator<float>_>::operator[](&local_a8,local_190);
    local_1c8 = 0x3fd0000000000000;
    testing::internal::EqHelper<false>::Compare<float,double>
              (in_stack_fffffffffffffd38,
               (char *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
               in_stack_fffffffffffffd28,
               (double *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1c0);
    if (!bVar1) {
      testing::Message::Message(&local_1d0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x154439);
      testing::internal::AssertHelper::AssertHelper
                (&local_1d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
                 ,0xa9,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
      testing::internal::AssertHelper::~AssertHelper(&local_1d8);
      testing::Message::~Message((Message *)0x154496);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1544ee);
    std::
    vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
    ::operator[](&vStack_d8,local_190);
    std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::begin(in_stack_fffffffffffffd18);
    while( true ) {
      std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::end(in_stack_fffffffffffffd18);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                          *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                         (__normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                          *)in_stack_fffffffffffffd18);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>::
      operator->((__normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                  *)&stack0xfffffffffffffe18);
      testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
                (in_stack_fffffffffffffd38,
                 (char *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
                 (uint *)in_stack_fffffffffffffd28,
                 (unsigned_long *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_208 + 1));
      if (!bVar1) {
        testing::Message::Message(local_208);
        in_stack_fffffffffffffd38 =
             testing::AssertionResult::failure_message((AssertionResult *)0x1545f8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_210,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
                   ,0xad,in_stack_fffffffffffffd38);
        testing::internal::AssertHelper::operator=(&local_210,local_208);
        testing::internal::AssertHelper::~AssertHelper(&local_210);
        testing::Message::~Message((Message *)0x154655);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1546aa);
      __gnu_cxx::
      __normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>::
      operator->((__normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                  *)&stack0xfffffffffffffe18);
      testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
                (in_stack_fffffffffffffd38,
                 (char *)CONCAT17(in_stack_fffffffffffffd37,in_stack_fffffffffffffd30),
                 (uint *)in_stack_fffffffffffffd28,
                 (unsigned_long *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
      in_stack_fffffffffffffd37 = testing::AssertionResult::operator_cast_to_bool(&local_220);
      if (!(bool)in_stack_fffffffffffffd37) {
        testing::Message::Message(&local_228);
        in_stack_fffffffffffffd28 =
             (float *)testing::AssertionResult::failure_message((AssertionResult *)0x15474c);
        testing::internal::AssertHelper::AssertHelper
                  (&local_230,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
                   ,0xae,(char *)in_stack_fffffffffffffd28);
        testing::internal::AssertHelper::operator=(&local_230,&local_228);
        testing::internal::AssertHelper::~AssertHelper(&local_230);
        testing::Message::~Message((Message *)0x1547a9);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x1547fe);
      __gnu_cxx::
      __normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>::
      operator->((__normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                  *)&stack0xfffffffffffffe18);
      testing::internal::CmpHelperFloatingPointEQ<float>
                ((char *)gtest_ar_6._0_8_,in_stack_000000e0,in_stack_000000dc,in_stack_000000d8);
      in_stack_fffffffffffffd27 = testing::AssertionResult::operator_cast_to_bool(&local_240);
      if (!(bool)in_stack_fffffffffffffd27) {
        testing::Message::Message(&local_248);
        in_stack_fffffffffffffd18 =
             (vector<xLearn::Node,_std::allocator<xLearn::Node>_> *)
             testing::AssertionResult::failure_message((AssertionResult *)0x15489e);
        testing::internal::AssertHelper::AssertHelper
                  (&local_250,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/data_structure_test.cc"
                   ,0xaf,(char *)in_stack_fffffffffffffd18);
        testing::internal::AssertHelper::operator=(&local_250,&local_248);
        testing::internal::AssertHelper::~AssertHelper(&local_250);
        testing::Message::~Message((Message *)0x1548f9);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x15494e);
      __gnu_cxx::
      __normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>::
      operator++((__normal_iterator<xLearn::Node_*,_std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_>
                  *)&stack0xfffffffffffffe18);
    }
  }
  DMatrix::~DMatrix((DMatrix *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
  DMatrix::~DMatrix((DMatrix *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
  return;
}

Assistant:

TEST(DMATRIX_TEST, CopyFrom) {
  DMatrix matrix;
  matrix.Reset();
  for (size_t i = 0; i < kLength; ++i) {
    matrix.AddRow();
    matrix.AddNode(i, i, 2.5, i);
    matrix.Y[i] = i;
    matrix.norm[i] = 0.25;
  }
  matrix.SetHash(1234, 5678);
  // Copy matrix
  DMatrix new_matrix;
  new_matrix.CopyFrom(&matrix);
  matrix.Reset();
  // Check
  EXPECT_EQ(new_matrix.row_length, kLength);
  EXPECT_EQ(new_matrix.hash_value_1, 1234);
  EXPECT_EQ(new_matrix.hash_value_2, 5678);
  EXPECT_EQ(new_matrix.has_label, true);
  for (size_t i = 0; i < kLength; ++i) {
    EXPECT_EQ(new_matrix.Y[i], i);
    EXPECT_EQ(new_matrix.norm[i], 0.25);
    SparseRow *row =new_matrix.row[i];
    for (SparseRow::iterator iter = row->begin();
         iter != row->end(); ++iter) {
      EXPECT_EQ(iter->field_id, i);
      EXPECT_EQ(iter->feat_id, i);
      EXPECT_FLOAT_EQ(iter->feat_val, 2.5);
    }
  }
}